

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.h
# Opt level: O2

Float __thiscall
pbrt::WindowedPiecewiseConstant2D::Eval(WindowedPiecewiseConstant2D *this,Point2f *p)

{
  float *pfVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Point2i p_00;
  
  iVar3 = (this->func).extent.pMax.super_Tuple2<pbrt::Point2,_int>.x -
          (this->func).extent.pMin.super_Tuple2<pbrt::Point2,_int>.x;
  iVar4 = iVar3 + -1;
  iVar3 = (int)((float)iVar3 * (p->super_Tuple2<pbrt::Point2,_float>).x);
  if (iVar3 <= iVar4) {
    iVar4 = iVar3;
  }
  iVar2 = (this->func).extent.pMax.super_Tuple2<pbrt::Point2,_int>.y -
          (this->func).extent.pMin.super_Tuple2<pbrt::Point2,_int>.y;
  iVar3 = iVar2 + -1;
  iVar2 = (int)((float)iVar2 * (p->super_Tuple2<pbrt::Point2,_float>).y);
  if (iVar2 <= iVar3) {
    iVar3 = iVar2;
  }
  p_00.super_Tuple2<pbrt::Point2,_int>.y = iVar3;
  p_00.super_Tuple2<pbrt::Point2,_int>.x = iVar4;
  pfVar1 = Array2D<float>::operator[](&this->func,p_00);
  return *pfVar1;
}

Assistant:

PBRT_CPU_GPU
    Float Eval(const Point2f &p) const {
        Point2i pi(std::min<int>(p[0] * func.xSize(), func.xSize() - 1),
                   std::min<int>(p[1] * func.ySize(), func.ySize() - 1));
        return func[pi];
    }